

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Testall(int count,MPIABI_Request *array_of_requests,int *flag,
                  MPIABI_Status *array_of_statuses)

{
  anon_union_24_2_44bf1552_for_mpi_status *paVar1;
  WPI_Status local_b8;
  int local_90;
  int local_8c;
  int i_1;
  int ierr;
  MPI_Status local_60;
  int local_44;
  MPIABI_Status *pMStack_40;
  int i;
  MPI_Status *stats;
  MPI_Request *reqs;
  MPIABI_Status *pMStack_28;
  bool ignore_statuses;
  MPIABI_Status *array_of_statuses_local;
  int *flag_local;
  MPIABI_Request *array_of_requests_local;
  int count_local;
  
  reqs._7_1_ = array_of_statuses == (MPIABI_Status *)0x0;
  pMStack_40 = array_of_statuses;
  stats = (MPI_Status *)array_of_requests;
  pMStack_28 = array_of_statuses;
  array_of_statuses_local = (MPIABI_Status *)flag;
  flag_local = (int *)array_of_requests;
  array_of_requests_local._4_4_ = count;
  if (!(bool)reqs._7_1_) {
    for (local_44 = 0; local_44 < array_of_requests_local._4_4_; local_44 = local_44 + 1) {
      WPI_Status::WPI_Status((WPI_Status *)&i_1,pMStack_28 + local_44);
      WPI_Status::operator_cast_to_ompi_status_public_t(&local_60,(WPI_Status *)&i_1);
      paVar1 = &pMStack_40->mpi_status + local_44;
      *(undefined8 *)paVar1 = local_60._0_8_;
      *(undefined8 *)((long)paVar1 + 8) = local_60._8_8_;
      *(size_t *)((long)paVar1 + 0x10) = local_60._ucount;
    }
  }
  local_8c = MPI_Testall(array_of_requests_local._4_4_,stats,array_of_statuses_local,pMStack_40);
  local_90 = array_of_requests_local._4_4_;
  if ((reqs._7_1_ & 1) == 0) {
    while (local_90 = local_90 + -1, -1 < local_90) {
      WPI_Status::WPI_Status(&local_b8,(MPI_Status *)(&pMStack_40->mpi_status + local_90));
      memcpy(pMStack_28 + local_90,&local_b8,0x28);
    }
  }
  return local_8c;
}

Assistant:

int MPIABI_Testall(int count, MPIABI_Request array_of_requests[],
                              int *flag, MPIABI_Status array_of_statuses[]) {
  const bool ignore_statuses =
      (MPI_Status *)array_of_statuses == MPI_STATUSES_IGNORE;
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  MPI_Status *const stats = (MPI_Status *)(void *)array_of_statuses;
  if (!ignore_statuses)
    for (int i = 0; i < count; ++i)
      stats[i] = (WPI_Status)array_of_statuses[i];
  const int ierr = MPI_Testall(count, reqs, flag, stats);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  if (!ignore_statuses)
    for (int i = count - 1; i >= 0; --i)
      array_of_statuses[i] = (WPI_Status)stats[i];
  return ierr;
}